

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::type_string
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this,string *string)

{
  size_type sVar1;
  size_type sVar2;
  
  sVar1 = string->_M_string_length;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)this + -0x10);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return;
}

Assistant:

void set_use_fast_tape() {
			use_fast_tape_ =
				!tape_player_is_sleeping_ &&
				allow_fast_tape_ &&
				tape_player_.has_tape() &&
				!(primary_slots_ & 3) &&
				!(memory_slots_[0].secondary_paging() & 3);
		}